

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

void outblank(void)

{
  int iVar1;
  
  outcnt = 1;
  iVar1 = out_is_hidden();
  if (iVar1 == 0) {
    outblank_stream(&G_std_disp);
    if (logfp != (osfildef *)0x0) {
      outblank_stream(&G_log_disp);
      fflush((FILE *)logfp);
      return;
    }
  }
  return;
}

Assistant:

void outblank()
{
    /* note that we've displayed something */
    outcnt = 1;

    /* check to see if we're hiding output */
    if (out_is_hidden())
        return;

    /* generate the newline to the standard display */
    outblank_stream(&G_std_disp);

    /* if we're logging, generate the newline to the log file as well */
    if (logfp != 0)
    {
        outblank_stream(&G_log_disp);
        osfflush(logfp);
    }
}